

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtraction.h
# Opt level: O2

void __thiscall Subtraction_PlusPlus_Test::TestBody(Subtraction_PlusPlus_Test *this)

{
  BigNumber *pBVar1;
  char *pcVar2;
  undefined1 local_90 [8];
  BigNumber num_1;
  AssertionResult gtest_ar_1;
  BigNumber local_48;
  AssertHelper local_20;
  AssertionResult gtest_ar;
  
  std::__cxx11::string::string((string *)&local_48,"1234",(allocator *)&num_1.m_symbol);
  BigNumber::BigNumber((BigNumber *)local_90,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  BigNumber::operator--(&local_48,(BigNumber *)local_90,0);
  BigNumber::toString_abi_cxx11_((string *)&num_1.m_symbol,&local_48);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_20,"\"1234\"","num_1--.toString()",(char (*) [5])"1234",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&num_1.m_symbol);
  std::__cxx11::string::~string((string *)&num_1.m_symbol);
  BigNumber::~BigNumber(&local_48);
  if (local_20.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&num_1.m_symbol,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/subtraction.h"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&num_1.m_symbol,(Message *)&local_48)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&num_1.m_symbol);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  BigNumber::toString_abi_cxx11_((string *)&local_48,(BigNumber *)local_90);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&num_1.m_symbol,"\"1233\"","num_1.toString()",(char (*) [5])"1233",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if ((undefined1)num_1.m_symbol == ZERO) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar_1._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/subtraction.h"
               ,0x19,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar_1);
  BigNumber::operator--(&local_48,(BigNumber *)local_90,0);
  BigNumber::toString_abi_cxx11_((string *)&num_1.m_symbol,&local_48);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_20,"\"1233\"","num_1--.toString()",(char (*) [5])"1233",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&num_1.m_symbol);
  std::__cxx11::string::~string((string *)&num_1.m_symbol);
  BigNumber::~BigNumber(&local_48);
  if (local_20.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&num_1.m_symbol,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/subtraction.h"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&num_1.m_symbol,(Message *)&local_48)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&num_1.m_symbol);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  pBVar1 = BigNumber::operator--((BigNumber *)local_90);
  BigNumber::toString_abi_cxx11_((string *)&local_48,pBVar1);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&num_1.m_symbol,"\"1231\"","(--num_1).toString()",(char (*) [5])"1231",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if ((undefined1)num_1.m_symbol == ZERO) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar_1._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/subtraction.h"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar_1);
  pBVar1 = BigNumber::operator--((BigNumber *)local_90);
  BigNumber::toString_abi_cxx11_((string *)&local_48,pBVar1);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&num_1.m_symbol,"\"1230\"","(--num_1).toString()",(char (*) [5])"1230",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if ((undefined1)num_1.m_symbol == ZERO) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar_1._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/subtraction.h"
               ,0x1c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar_1);
  BigNumber::toString_abi_cxx11_((string *)&local_48,(BigNumber *)local_90);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&num_1.m_symbol,"\"1230\"","num_1.toString()",(char (*) [5])"1230",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if ((undefined1)num_1.m_symbol == ZERO) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar_1._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/subtraction.h"
               ,0x1d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar_1);
  BigNumber::~BigNumber((BigNumber *)local_90);
  return;
}

Assistant:

TEST(Subtraction, PlusPlus)
{
    BigNumber num_1("1234");
    EXPECT_EQ("1234", num_1--.toString());
    EXPECT_EQ("1233", num_1.toString());
    EXPECT_EQ("1233", num_1--.toString());
    EXPECT_EQ("1231", (--num_1).toString());
    EXPECT_EQ("1230", (--num_1).toString());
    EXPECT_EQ("1230", num_1.toString());
}